

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O2

void __thiscall QSizeGripPrivate::updateTopLevelWidget(QSizeGripPrivate *this)

{
  QPointer<QWidget> *this_00;
  Data *pDVar1;
  bool bVar2;
  QWidget *ptr;
  QWidget *pQVar3;
  
  ptr = qt_sizegrip_topLevelWidget(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8);
  pDVar1 = (this->tlw).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QWidget *)0x0;
  }
  else {
    pQVar3 = (QWidget *)(this->tlw).wp.value;
  }
  if (pQVar3 != ptr) {
    this_00 = &this->tlw;
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      QObject::removeEventFilter((this->tlw).wp.value);
    }
    QWeakPointer<QObject>::assign<QObject>(&this_00->wp,&ptr->super_QObject);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar2) {
      QObject::installEventFilter((this->tlw).wp.value);
      return;
    }
  }
  return;
}

Assistant:

void updateTopLevelWidget()
    {
        Q_Q(QSizeGrip);
        QWidget *w = qt_sizegrip_topLevelWidget(q);
        if (tlw == w)
            return;
        if (tlw)
            tlw->removeEventFilter(q);
        tlw = w;
        if (tlw)
            tlw->installEventFilter(q);
    }